

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

void density_tests::detail::
     single_queue_generic_test<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
               (QueueTesterFlags i_flags,ostream *i_output,EasyRandom *i_random,
               size_t i_element_count,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *i_thread_count_vector)

{
  pointer puVar1;
  pointer puVar2;
  QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
  tester;
  ostream *local_d8;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined4 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  unsigned_long local_38;
  
  puVar1 = (i_thread_count_vector->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (i_thread_count_vector->
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    local_38 = *puVar2;
    local_c8 = 1;
    local_c0 = 0;
    uStack_b8 = 0;
    local_b0 = 0x3f800000;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_d8 = i_output;
    local_d0 = &uStack_a0;
    QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
    ::
    add_test_case<density_tests::detail::PutInt<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>>
              ((QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
                *)&local_d8);
    QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
    ::
    add_test_case<density_tests::detail::PutUInt8<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>>
              ((QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
                *)&local_d8);
    QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
    ::
    add_test_case<density_tests::detail::PutUInt16<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>>
              ((QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
                *)&local_d8);
    QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
    ::
    add_test_case<density_tests::detail::PutString<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>>
              ((QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
                *)&local_d8);
    QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
    ::
    add_test_case<density_tests::detail::PutTestObject<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>,128ul,8ul>>
              ((QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
                *)&local_d8);
    QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
    ::
    add_test_case<density_tests::detail::PutTestObject<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>,256ul,128ul>>
              ((QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
                *)&local_d8);
    QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
    ::
    add_test_case<density_tests::detail::PutTestObject<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>,2048ul,2048ul>>
              ((QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
                *)&local_d8);
    QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
    ::
    add_test_case<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>>
              ((QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
                *)&local_d8);
    QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
    ::
    add_test_case<density_tests::detail::ReentrantPush<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>>
              ((QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
                *)&local_d8);
    QueueGenericTester<density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
    ::run((QueueGenericTester<density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
           *)&local_d8,i_flags,i_random,i_element_count);
    QueueGenericTester<density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
    ::~QueueGenericTester
              ((QueueGenericTester<density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
                *)&local_d8);
  }
  return;
}

Assistant:

void single_queue_generic_test(
          QueueTesterFlags    i_flags,
          std::ostream &      i_output,
          EasyRandom &        i_random,
          size_t              i_element_count,
          std::vector<size_t> i_thread_count_vector)
        {
            for (auto thread_count : i_thread_count_vector)
            {
                QueueGenericTester<QUEUE> tester(i_output, thread_count);
                tester.template add_test_case<PutInt<QUEUE>>();
                tester.template add_test_case<PutUInt8<QUEUE>>();
                tester.template add_test_case<PutUInt16<QUEUE>>();
                tester.template add_test_case<PutString<QUEUE>>();
                tester.template add_test_case<PutTestObject<QUEUE, 128, 8>>();
                tester.template add_test_case<PutTestObject<QUEUE, 256, 128>>();
                tester.template add_test_case<PutTestObject<QUEUE, 2048, 2048>>();
                tester.template add_test_case<PutRawBlocks<QUEUE>>();
                tester.template add_test_case<ReentrantPush<QUEUE>>();

                tester.run(i_flags, i_random, i_element_count);
            }
        }